

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

void __thiscall ot::commissioner::Timer::Start(Timer *this,TimePoint aFireTime)

{
  int iVar1;
  long lVar2;
  timeval local_20;
  
  if (this->mEnabled == true) {
    Stop(this);
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  local_20.tv_sec = ((long)aFireTime.__d.__r - lVar2) / 1000000000;
  local_20.tv_usec = (((long)aFireTime.__d.__r - lVar2) / 1000) % 1000000;
  iVar1 = event_add(&this->mTimerEvent,&local_20);
  if (iVar1 == 0) {
    (this->mFireTime).__d.__r = (rep)aFireTime.__d.__r;
    this->mEnabled = true;
    return;
  }
  abort();
}

Assistant:

void Start(TimePoint aFireTime)
    {
        // In case the timer has already been started, stop it first.
        if (mEnabled)
        {
            Stop();
        }

        auto delay = std::chrono::duration_cast<std::chrono::microseconds>(aFireTime - Clock::now());

        struct timeval tv;
        evutil_timerclear(&tv);
        tv.tv_sec  = delay.count() / 1000000;
        tv.tv_usec = delay.count() % 1000000;

        VerifyOrDie(event_add(&mTimerEvent, &tv) == 0);
        mFireTime = aFireTime;
        mEnabled  = true;
    }